

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O1

void __thiscall leveldb::LookupKey::LookupKey(LookupKey *this,Slice *user_key,SequenceNumber s)

{
  long lVar1;
  size_t __n;
  char *pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = user_key->size_;
  if (__n + 0xd < 0xc9) {
    pcVar2 = this->space_;
  }
  else {
    pcVar2 = (char *)operator_new__(__n + 0xd);
  }
  this->start_ = pcVar2;
  pcVar2 = EncodeVarint32(pcVar2,(int)__n + 8);
  this->kstart_ = pcVar2;
  memcpy(pcVar2,user_key->data_,__n);
  if (s >> 0x38 == 0) {
    *(SequenceNumber *)(pcVar2 + __n) = s * 0x100 + 1;
    this->end_ = pcVar2 + __n + 8;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("seq <= kMaxSequenceNumber",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.cc"
                ,0x11,"uint64_t leveldb::PackSequenceAndType(uint64_t, ValueType)");
}

Assistant:

LookupKey::LookupKey(const Slice& user_key, SequenceNumber s) {
  size_t usize = user_key.size();
  size_t needed = usize + 13;  // A conservative estimate
  char* dst;
  if (needed <= sizeof(space_)) {
    dst = space_;
  } else {
    dst = new char[needed];
  }
  start_ = dst;
  dst = EncodeVarint32(dst, usize + 8);
  kstart_ = dst;
  memcpy(dst, user_key.data(), usize);
  dst += usize;
  EncodeFixed64(dst, PackSequenceAndType(s, kValueTypeForSeek));
  dst += 8;
  end_ = dst;
}